

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::update_beamlets_impact
          (EvaluationFunction *this,int o,int k,double prev_Dok)

{
  double dVar1;
  pair<int,_int> pVar2;
  bool bVar3;
  reference ppVar4;
  mapped_type *pmVar5;
  Matrix *this_00;
  reference this_01;
  reference pvVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Volume *in_XMM0_Qa;
  double dVar7;
  Matrix *Dep;
  int b;
  int angle;
  pair<int,_int> bl;
  iterator __end1;
  iterator __begin1;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *beamlets;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_stack_ffffffffffffff80;
  Volume *this_02;
  int iStack_44;
  _Self local_40;
  _Self local_38;
  mapped_type *local_30;
  pair<int,_int> local_28;
  mapped_type *local_20;
  Volume *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_28 = std::make_pair<int&,int&>
                       ((int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (int *)0x12b744);
  local_30 = std::
             unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff80,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
  ;
  local_20 = local_30;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                 ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while( true ) {
    bVar3 = std::operator!=(&local_38,&local_40);
    if (!bVar3) break;
    ppVar4 = std::_List_iterator<std::pair<int,_int>_>::operator*
                       ((_List_iterator<std::pair<int,_int>_> *)0x12b7a7);
    pVar2 = *ppVar4;
    this_02 = local_18;
    pmVar5 = std::
             unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
             ::operator[]((unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                           *)local_18,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    *pmVar5 = *pmVar5 - (double)this_02;
    iStack_44 = pVar2.second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)local_c);
    this_00 = Volume::getDepositionMatrix(this_02,in_stack_ffffffffffffff7c);
    this_01 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(in_RDI + 0x150),(long)local_c);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_10);
    dVar1 = *pvVar6;
    dVar7 = maths::Matrix::operator()(this_00,local_10,iStack_44);
    pmVar5 = std::
             unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
             ::operator[]((unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                           *)this_02,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    *pmVar5 = dVar1 * dVar7 + *pmVar5;
    std::_List_iterator<std::pair<int,_int>_>::operator++(&local_38);
  }
  return;
}

Assistant:

void EvaluationFunction::update_beamlets_impact(int o, int k, double prev_Dok){
	list<pair <int,int> >& beamlets = voxel2beamlet_list[make_pair(o,k)];
	for(auto bl:beamlets){
		beamlet_impact[bl] -= prev_Dok;
		int angle = bl.first;
		int b = bl.second;
		const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		beamlet_impact[bl] += D[o][k] * Dep(k,b);
	}


}